

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_method_get(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  TRef TVar5;
  TRef tru;
  TRef len;
  ptrdiff_t arg;
  TRef tr;
  TRef trw;
  TRef trr;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  TRef fref;
  TRef len_1;
  
  TVar4 = recff_sbufx_check(J,rd,0);
  IVar2 = (IRRef1)TVar4;
  (J->fold).ins.field_0.ot = 0x4509;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = 0x13;
  tr = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x4509;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = 0xe;
  TVar4 = lj_opt_fold(J);
  if (J->base[1] == 0) {
    J->base[1] = 0x7fff;
    J->base[2] = 0;
  }
  for (_tru = 0; J->base[_tru + 1] != 0; _tru = _tru + 1) {
    if ((J->base[_tru + 1] & 0x1f000000) != 0) {
      TVar5 = recff_sbufx_checkint(J,rd,_tru + 1);
      J->base[_tru + 1] = TVar5;
    }
  }
  for (_tru = 0; uVar1 = J->base[_tru + 1], uVar1 != 0; _tru = _tru + 1) {
    IVar3 = (IRRef1)tr;
    (J->fold).ins.field_0.ot = 0x2a15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar3;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = 0x1275;
    TVar5 = lj_opt_fold(J);
    if ((uVar1 & 0x1f000000) == 0) {
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar5 = lj_opt_fold(J);
      J->base[_tru] = TVar5;
      tr = TVar4;
    }
    else {
      (J->fold).ins.field_0.ot = 0x3213;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar1;
      TVar5 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      tr = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar5 = lj_opt_fold(J);
      J->base[_tru] = TVar5;
    }
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0x13;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)tr;
    lj_opt_fold(J);
  }
  rd->nres = _tru;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_get(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) { J->base[1] = TREF_NIL; J->base[2] = 0; }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    if (!tref_isnil(tr)) {
      J->base[arg+1] = recff_sbufx_checkint(J, rd, arg+1);
    }
  }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    TRef len = recff_sbufx_len(J, trr, trw);
    if (tref_isnil(tr)) {
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = trw;
    } else {
      TRef tru;
      len = emitir(IRTI(IR_MIN), len, tr);
      tru = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = tru;  /* Doing the ADD before the SNEW generates better code. */
    }
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
  }
  rd->nres = arg;
}